

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

bool TestDerive(FileTest *t,KeyMap *key_map,EVP_PKEY *key)

{
  pointer *this;
  evp_pkey_ctx_st *ctx_00;
  bool bVar1;
  int iVar2;
  pointer peVar3;
  const_iterator ppeVar4;
  uchar *puVar5;
  char *pcVar6;
  char *in_R9;
  string local_268;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_;
  Message local_218;
  Span<const_unsigned_char> local_210;
  Bytes local_200;
  Bytes local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  Span<const_unsigned_char> local_198;
  Bytes local_188;
  Span<const_unsigned_char> local_178;
  Bytes local_168;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140;
  Span<const_unsigned_char> local_138;
  Bytes local_128;
  Span<const_unsigned_char> local_118;
  Bytes local_108;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  string local_e0;
  undefined1 local_c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actual;
  size_t len;
  EVP_PKEY_CTX *pctx;
  const_iterator __end1;
  const_iterator __begin1;
  pointer local_68;
  initializer_list<evp_pkey_ctx_st_*> local_60;
  initializer_list<evp_pkey_ctx_st_*> *local_50;
  initializer_list<evp_pkey_ctx_st_*> *__range1;
  UniquePtr<EVP_PKEY_CTX> copy;
  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> local_30;
  UniquePtr<EVP_PKEY_CTX> ctx;
  EVP_PKEY *key_local;
  KeyMap *key_map_local;
  FileTest *t_local;
  
  ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)key;
  peVar3 = (pointer)EVP_PKEY_CTX_new((EVP_PKEY *)key,(ENGINE *)0x0);
  std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter> *)&local_30,peVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    peVar3 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get(&local_30);
    iVar2 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)peVar3);
    if (iVar2 != 0) {
      peVar3 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get(&local_30);
      bVar1 = SetupContext(t,key_map,peVar3);
      if (bVar1) {
        peVar3 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get(&local_30);
        peVar3 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)peVar3);
        std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter> *)&__range1,peVar3);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&__range1);
        if (bVar1) {
          __begin1 = (const_iterator)
                     std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get(&local_30);
          local_68 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&__range1);
          local_60._M_array = (iterator)&__begin1;
          local_60._M_len = 2;
          local_50 = &local_60;
          __end1 = std::initializer_list<evp_pkey_ctx_st_*>::begin(local_50);
          ppeVar4 = std::initializer_list<evp_pkey_ctx_st_*>::end(local_50);
          for (; __end1 != ppeVar4; __end1 = __end1 + 1) {
            ctx_00 = *__end1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
            iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)ctx_00,(uchar *)0x0,
                                    (size_t *)
                                    &actual.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (iVar2 == 0) {
              t_local._7_1_ = 0;
              copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)
                         actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
              puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &output.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)ctx_00,puVar5,
                                      (size_t *)
                                      &actual.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (iVar2 == 0) {
                t_local._7_1_ = 0;
                copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)
                           actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e0,"Output",
                           (allocator<char> *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7));
                bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_c0,&local_e0);
                std::__cxx11::string::~string((string *)&local_e0);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7));
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_118,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
                  Bytes::Bytes(&local_108,local_118);
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_138,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &output.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                  Bytes::Bytes(&local_128,local_138);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_f8,"Bytes(output)","Bytes(actual)",&local_108,
                             &local_128);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_f8);
                  if (!bVar1) {
                    testing::Message::Message(&local_140);
                    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0x160,pcVar6);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_1.message_,&local_140);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_1.message_);
                    testing::Message::~Message(&local_140);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &output.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)
                             (actual.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
                  this = &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                  actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           this);
                  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this)
                  ;
                  iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)ctx_00,puVar5,
                                          (size_t *)
                                          &actual.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (iVar2 == 0) {
                    t_local._7_1_ = 0;
                    copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)
                               actual.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_178,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
                    Bytes::Bytes(&local_168,local_178);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_198,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    Bytes::Bytes(&local_188,local_198);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_158,"Bytes(output)","Bytes(actual)",&local_168,
                               &local_188);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_158);
                    if (!bVar1) {
                      testing::Message::Message(&local_1a0);
                      pcVar6 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_158);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_1a8,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0x169,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
                      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
                      testing::Message::~Message(&local_1a0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)
                               (actual.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + -1));
                    actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage =
                         (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&output.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                    ;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"SmallBufferTruncates",
                               (allocator<char> *)
                               ((long)&gtest_ar_2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 7));
                    bVar1 = FileTest::HasAttribute(t,&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&gtest_ar_2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 7));
                    if (bVar1) {
                      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &output.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)ctx_00,puVar5,
                                              (size_t *)
                                              &actual.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (iVar2 == 0) {
                        t_local._7_1_ = 0;
                        copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
                        goto LAB_00377ecf;
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &output.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)
                                 actual.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
                      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_c0);
                      Bytes::Bytes(&local_1f0,puVar5,
                                   (size_t)actual.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bssl::Span<unsigned_char_const>::
                      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((Span<unsigned_char_const> *)&local_210,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &output.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                      Bytes::Bytes(&local_200,local_210);
                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                ((EqHelper *)local_1e0,"Bytes(output.data(), len)","Bytes(actual)",
                                 &local_1f0,&local_200);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_1e0);
                      if (!bVar1) {
                        testing::Message::Message(&local_218);
                        pcVar6 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_1e0);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                   ,0x173,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,&local_218);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        testing::Message::~Message(&local_218);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
                    }
                    else {
                      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &output.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)ctx_00,puVar5,
                                              (size_t *)
                                              &actual.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      local_231 = iVar2 == 0;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_230,&local_231,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_230);
                      if (!bVar1) {
                        testing::Message::Message(&local_240);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_268,(internal *)local_230,
                                   (AssertionResult *)"EVP_PKEY_derive(pctx, actual.data(), &len)",
                                   "true","false",in_R9);
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_248,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                   ,0x175,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_248,&local_240);
                        testing::internal::AssertHelper::~AssertHelper(&local_248);
                        std::__cxx11::string::~string((string *)&local_268);
                        testing::Message::~Message(&local_240);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                      ERR_clear_error();
                    }
                    copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 0;
                  }
                }
                else {
                  t_local._7_1_ = 0;
                  copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
                }
              }
            }
LAB_00377ecf:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((int)copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl != 0)
            goto LAB_00377f31;
          }
          t_local._7_1_ = 1;
          copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          t_local._7_1_ = 0;
          copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
        }
LAB_00377f31:
        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&__range1);
        goto LAB_00377f3a;
      }
    }
  }
  t_local._7_1_ = 0;
  copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
LAB_00377f3a:
  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return (bool)(t_local._7_1_ & 1);
}

Assistant:

static bool TestDerive(FileTest *t, KeyMap *key_map, EVP_PKEY *key) {
  bssl::UniquePtr<EVP_PKEY_CTX> ctx(EVP_PKEY_CTX_new(key, nullptr));
  if (!ctx ||
      !EVP_PKEY_derive_init(ctx.get()) ||
      !SetupContext(t, key_map, ctx.get())) {
    return false;
  }

  bssl::UniquePtr<EVP_PKEY_CTX> copy(EVP_PKEY_CTX_dup(ctx.get()));
  if (!copy) {
    return false;
  }

  for (EVP_PKEY_CTX *pctx : {ctx.get(), copy.get()}) {
    size_t len;
    std::vector<uint8_t> actual, output;
    if (!EVP_PKEY_derive(pctx, nullptr, &len)) {
      return false;
    }
    actual.resize(len);
    if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
      return false;
    }
    actual.resize(len);

    // Defer looking up the attribute so Error works properly.
    if (!t->GetBytes(&output, "Output")) {
      return false;
    }
    EXPECT_EQ(Bytes(output), Bytes(actual));

    // Test when the buffer is too large.
    actual.resize(len + 1);
    len = actual.size();
    if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
      return false;
    }
    actual.resize(len);
    EXPECT_EQ(Bytes(output), Bytes(actual));

    // Test when the buffer is too small.
    actual.resize(len - 1);
    len = actual.size();
    if (t->HasAttribute("SmallBufferTruncates")) {
      if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
        return false;
      }
      actual.resize(len);
      EXPECT_EQ(Bytes(output.data(), len), Bytes(actual));
    } else {
      EXPECT_FALSE(EVP_PKEY_derive(pctx, actual.data(), &len));
      ERR_clear_error();
    }
  }
  return true;
}